

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstant
          (Parser *this,EnumValueDescriptorProto *enum_value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  int number;
  LocationRecorder location;
  int32 local_44;
  LocationRecorder local_40;
  
  LocationRecorder::LocationRecorder(&local_40,enum_value_location,1);
  LocationRecorder::RecordLegacyLocation(&local_40,&enum_value->super_Message,NAME);
  *(byte *)(enum_value->_has_bits_).has_bits_ = (byte)(enum_value->_has_bits_).has_bits_[0] | 1;
  output = (enum_value->name_).ptr_;
  if (output == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena
              (&enum_value->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    output = (enum_value->name_).ptr_;
  }
  bVar1 = ConsumeIdentifier(this,output,"Expected enum constant name.");
  LocationRecorder::~LocationRecorder(&local_40);
  if ((bVar1) && (bVar1 = Consume(this,"=","Missing numeric value for enum constant."), bVar1)) {
    LocationRecorder::LocationRecorder(&local_40,enum_value_location,2);
    LocationRecorder::RecordLegacyLocation(&local_40,&enum_value->super_Message,NUMBER);
    bVar1 = ConsumeSignedInteger(this,&local_44,"Expected integer.");
    if (bVar1) {
      (enum_value->_has_bits_).has_bits_[0] = (enum_value->_has_bits_).has_bits_[0] | 4;
      enum_value->number_ = local_44;
      LocationRecorder::~LocationRecorder(&local_40);
      bVar1 = ParseEnumConstantOptions(this,enum_value,enum_value_location,containing_file);
      if (bVar1) {
        bVar1 = ConsumeEndOfDeclaration(this,";",enum_value_location);
        return bVar1;
      }
    }
    else {
      LocationRecorder::~LocationRecorder(&local_40);
    }
  }
  return false;
}

Assistant:

bool Parser::ParseEnumConstant(EnumValueDescriptorProto* enum_value,
                               const LocationRecorder& enum_value_location,
                               const FileDescriptorProto* containing_file) {
  // Parse name.
  {
    LocationRecorder location(enum_value_location,
                              EnumValueDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        enum_value, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(enum_value->mutable_name(),
                         "Expected enum constant name."));
  }

  DO(Consume("=", "Missing numeric value for enum constant."));

  // Parse value.
  {
    LocationRecorder location(
        enum_value_location, EnumValueDescriptorProto::kNumberFieldNumber);
    location.RecordLegacyLocation(
        enum_value, DescriptorPool::ErrorCollector::NUMBER);

    int number;
    DO(ConsumeSignedInteger(&number, "Expected integer."));
    enum_value->set_number(number);
  }

  DO(ParseEnumConstantOptions(enum_value, enum_value_location,
                              containing_file));

  DO(ConsumeEndOfDeclaration(";", &enum_value_location));

  return true;
}